

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.h
# Opt level: O2

LPUTF8 utf8::Encode<false>(char16 ch,LPUTF8 ptr,void *bufferEnd)

{
  LPUTF8 puVar1;
  
  if ((ushort)ch < 0x80) {
    CodexAssertOrFailFast(ptr < bufferEnd);
    *ptr = (utf8char_t)ch;
    return ptr + 1;
  }
  puVar1 = EncodeFull<false>(ch,ptr,bufferEnd);
  return puVar1;
}

Assistant:

inline LPUTF8 Encode(char16 ch, _When_(!countBytesOnly, __out_ecount(3)) LPUTF8 ptr, const void * bufferEnd)
    {
        if (ch < 0x80)
        {
            if (!countBytesOnly)
            {
                CodexAssertOrFailFast(ptr < bufferEnd);
                *ptr = static_cast<utf8char_t>(ch);
            }
            return ptr + 1;
        }
        return EncodeFull<countBytesOnly>(ch, ptr, bufferEnd);
    }